

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O0

double ON_ArrayMagnitude(int dim,double *A)

{
  double dVar1;
  double dVar2;
  double local_38;
  double len;
  double c;
  double b;
  double a;
  double *A_local;
  int dim_local;
  
  if (dim == 1) {
    local_38 = ABS(*A);
  }
  else if (dim == 2) {
    local_38 = ABS(*A);
    dVar1 = ABS(A[1]);
    if (local_38 <= dVar1) {
      if (dVar1 <= local_38) {
        local_38 = local_38 * 1.4142135623730951;
      }
      else {
        local_38 = sqrt((local_38 / dVar1) * (local_38 / dVar1) + 1.0);
        local_38 = dVar1 * local_38;
      }
    }
    else {
      dVar1 = sqrt((dVar1 / local_38) * (dVar1 / local_38) + 1.0);
      local_38 = local_38 * dVar1;
    }
  }
  else if (dim == 3) {
    local_38 = ABS(*A);
    dVar1 = ABS(A[1]);
    dVar2 = ABS(A[2]);
    if (local_38 < dVar1) {
      if (dVar1 < dVar2) {
        local_38 = sqrt((local_38 / dVar2) * (local_38 / dVar2) + (dVar1 / dVar2) * (dVar1 / dVar2)
                        + 1.0);
        local_38 = dVar2 * local_38;
      }
      else {
        local_38 = sqrt((local_38 / dVar1) * (local_38 / dVar1) + (dVar2 / dVar1) * (dVar2 / dVar1)
                        + 1.0);
        local_38 = dVar1 * local_38;
      }
    }
    else if (local_38 < dVar2) {
      local_38 = sqrt((local_38 / dVar2) * (local_38 / dVar2) + (dVar1 / dVar2) * (dVar1 / dVar2) +
                      1.0);
      local_38 = dVar2 * local_38;
    }
    else if (((local_38 != dVar1) || (local_38 != dVar2)) || (NAN(local_38) || NAN(dVar2))) {
      dVar1 = sqrt((dVar1 / local_38) * (dVar1 / local_38) + (dVar2 / local_38) * (dVar2 / local_38)
                   + 1.0);
      local_38 = local_38 * dVar1;
    }
    else {
      local_38 = local_38 * 1.7320508075688772;
    }
  }
  else {
    local_38 = 0.0;
    a = (double)A;
    A_local._4_4_ = dim;
    while (A_local._4_4_ != 0) {
      local_38 = *(double *)a * *(double *)a + local_38;
      a = (double)((long)a + 8);
      A_local._4_4_ = A_local._4_4_ + -1;
    }
    local_38 = sqrt(local_38);
  }
  return local_38;
}

Assistant:

double ON_ArrayMagnitude(int dim, const double* A)
{
  double a, b, c, len;
  switch(dim) {
  case 1:
    len = fabs(*A); 
    break;
  case 2:
    a = fabs(*A++); b = fabs(*A);
    if (a > b) 
      {b /= a; len = a*sqrt(1.0+b*b);}
    else if (b > a) 
      {a /= b; len = b*sqrt(1.0+a*a);}
    else
      len = a*ON_SQRT2;
    break;
  case 3:
    a = fabs(*A++); b = fabs(*A++); c = fabs(*A);
    if (a >= b) {
      if (a >= c) {
        if (a == b && a == c) 
          len = a*ON_SQRT3;
        else
          {b /= a; c /= a; len = a*sqrt(1.0 + (b*b + c*c));}
      }
      else 
        {a /= c; b /= c; len = c*sqrt(1.0 + (a*a + b*b));}
    }
    else if (b >= c) 
      {a /= b; c /= b; len = b*sqrt(1.0 + (a*a + c*c));}
    else 
      {b /= c; a /= c; len = c*sqrt(1.0 + (a*a + b*b));}
    break;
  default:
    len = 0.0;
    while (dim--) {a = *A++; len += a*a;}
    len = sqrt(len);
    break;
  }
  return len;
}